

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printing.cpp
# Opt level: O2

void __thiscall PrintingTest_Print_Test::TestBody(PrintingTest_Print_Test *this)

{
  Function *pFVar1;
  char *pcVar2;
  Name NVar3;
  Name NVar4;
  undefined1 local_5e0 [8];
  Module wasm;
  stringstream ss;
  ostream local_1e0 [376];
  Name local_68;
  Name local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  internal local_28 [8];
  AssertionResult gtest_ar;
  
  ::wasm::Module::Module((Module *)local_5e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&wasm.tagsMap._M_h._M_single_bucket,
             "\n    (module\n      (func $a (result i32)\n        (i32.const 10)\n      )\n      (func $b\n        (drop\n          (i32.const 20)\n        )\n      )\n    )\n  "
             ,(allocator<char> *)&local_48);
  PrintTest::parseWast
            (&this->super_PrintingTest,(Module *)local_5e0,
             (string *)&wasm.tagsMap._M_h._M_single_bucket);
  std::__cxx11::string::~string((string *)&wasm.tagsMap._M_h._M_single_bucket);
  std::__cxx11::stringstream::stringstream((stringstream *)&wasm.tagsMap._M_h._M_single_bucket);
  ::wasm::Name::Name(&local_68,"a");
  NVar3.super_IString.str._M_str = (char *)local_68.super_IString.str._M_len;
  NVar3.super_IString.str._M_len = (size_t)local_5e0;
  pFVar1 = (Function *)::wasm::Module::getFunction(NVar3);
  std::operator<<(local_1e0,pFVar1);
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[41]>
            (local_28,"ss.str()","R\"print((func $a (result i32)\n (i32.const 10)\n)\n)print\"",
             &local_48,(char (*) [41])"(func $a (result i32)\n (i32.const 10)\n)\n");
  std::__cxx11::string::~string((string *)&local_48);
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (gtest_ar._0_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/printing.cpp"
               ,0x20,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar.message_,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    if ((long *)local_48._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_48._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar);
  std::__cxx11::stringstream::~stringstream((stringstream *)&wasm.tagsMap._M_h._M_single_bucket);
  std::__cxx11::stringstream::stringstream((stringstream *)&wasm.tagsMap._M_h._M_single_bucket);
  ::wasm::Name::Name(&local_58,"b");
  NVar4.super_IString.str._M_str = (char *)local_58.super_IString.str._M_len;
  NVar4.super_IString.str._M_len = (size_t)local_5e0;
  pFVar1 = (Function *)::wasm::Module::getFunction(NVar4);
  std::operator<<(local_1e0,pFVar1);
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[39]>
            (local_28,"ss.str()","R\"print((func $b\n (drop\n  (i32.const 20)\n )\n)\n)print\"",
             &local_48,(char (*) [39])"(func $b\n (drop\n  (i32.const 20)\n )\n)\n");
  std::__cxx11::string::~string((string *)&local_48);
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (gtest_ar._0_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/printing.cpp"
               ,0x2a,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar.message_,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    if ((long *)local_48._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_48._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar);
  std::__cxx11::stringstream::~stringstream((stringstream *)&wasm.tagsMap._M_h._M_single_bucket);
  ::wasm::Module::~Module((Module *)local_5e0);
  return;
}

Assistant:

TEST_F(PrintingTest, Print) {
  auto moduleText = R"wasm(
    (module
      (func $a (result i32)
        (i32.const 10)
      )
      (func $b
        (drop
          (i32.const 20)
        )
      )
    )
  )wasm";

  Module wasm;
  parseWast(wasm, moduleText);

  {
    std::stringstream ss;
    ss << *wasm.getFunction("a");
    EXPECT_EQ(ss.str(), R"print((func $a (result i32)
 (i32.const 10)
)
)print");
  }
  {
    std::stringstream ss;
    ss << *wasm.getFunction("b");
    EXPECT_EQ(ss.str(), R"print((func $b
 (drop
  (i32.const 20)
 )
)
)print");
  }
}